

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_trace_striped_sse2_128_16.c
# Opt level: O2

parasail_result_t *
parasail_nw_trace_striped_profile_sse2_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  undefined8 *puVar1;
  ushort *puVar2;
  ushort *puVar3;
  short *psVar4;
  void *pvVar5;
  parasail_matrix_t *ppVar6;
  int *piVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  int iVar35;
  int iVar36;
  parasail_result_t *ppVar37;
  __m128i *ptr;
  __m128i *palVar38;
  __m128i *ptr_00;
  __m128i *ptr_01;
  __m128i *palVar39;
  __m128i *ptr_02;
  int16_t *ptr_03;
  __m128i *ptr_04;
  int16_t iVar40;
  long lVar41;
  __m128i *ptr_05;
  char *pcVar42;
  long lVar43;
  uint uVar44;
  uint uVar45;
  int iVar46;
  char *__format;
  int a;
  ulong uVar48;
  ulong uVar49;
  long lVar50;
  int32_t segNum;
  long lVar51;
  long lVar52;
  undefined8 unaff_R12;
  int iVar53;
  ulong size;
  bool bVar54;
  undefined4 uVar55;
  ulong uVar57;
  undefined1 auVar58 [16];
  undefined4 uVar56;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  __m128i alVar61;
  ushort uVar62;
  short sVar63;
  short sVar64;
  ushort uVar67;
  short sVar69;
  ushort uVar70;
  short sVar72;
  ushort uVar73;
  ushort uVar75;
  short sVar78;
  ushort uVar79;
  short sVar82;
  ushort uVar83;
  short sVar86;
  ushort uVar87;
  undefined1 auVar65 [16];
  short sVar68;
  short sVar71;
  short sVar74;
  short sVar77;
  short sVar81;
  short sVar85;
  short sVar89;
  undefined1 auVar66 [16];
  undefined1 auVar90 [16];
  ushort uVar91;
  ushort uVar93;
  ushort uVar94;
  ushort uVar95;
  ushort uVar96;
  ushort uVar97;
  ushort uVar98;
  ushort uVar99;
  undefined1 auVar92 [16];
  ushort uVar100;
  short sVar101;
  short sVar102;
  short sVar103;
  short sVar104;
  short sVar105;
  ushort uVar106;
  short sVar107;
  ushort uVar108;
  short sVar109;
  short sVar110;
  short sVar111;
  ushort uVar112;
  short sVar113;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  ushort uVar116;
  ushort uVar119;
  ushort uVar120;
  ushort uVar121;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  long local_f8;
  ushort local_88;
  ushort uStack_86;
  __m128i_16_t e;
  __m128i_16_t h;
  ulong uVar47;
  ushort uVar76;
  ushort uVar80;
  ushort uVar84;
  ushort uVar88;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar42 = "profile";
  }
  else {
    pvVar5 = (profile->profile16).score;
    if (pvVar5 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar42 = "profile->profile16.score";
    }
    else {
      ppVar6 = profile->matrix;
      if (ppVar6 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar42 = "profile->matrix";
      }
      else {
        uVar45 = profile->s1Len;
        if ((int)uVar45 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar42 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar42 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar42 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar42 = "open";
        }
        else {
          if (-1 < gap) {
            uVar44 = uVar45 - 1;
            size = (ulong)uVar45 + 7 >> 3;
            iVar53 = -open;
            iVar35 = ppVar6->min;
            iVar36 = -iVar35;
            if (iVar35 != iVar53 && SBORROW4(iVar35,iVar53) == iVar35 + open < 0) {
              iVar36 = open;
            }
            iVar35 = ppVar6->max;
            a = (int)size;
            ppVar37 = parasail_result_new_trace(a,s2Len,0x10,0x10);
            if (ppVar37 != (parasail_result_t *)0x0) {
              ppVar37->flag = ppVar37->flag | 0x8280801;
              ptr = parasail_memalign___m128i(0x10,size);
              palVar38 = parasail_memalign___m128i(0x10,size);
              ptr_00 = parasail_memalign___m128i(0x10,size);
              ptr_01 = parasail_memalign___m128i(0x10,size);
              palVar39 = parasail_memalign___m128i(0x10,size);
              ptr_02 = parasail_memalign___m128i(0x10,size);
              uVar45 = s2Len + 1;
              uVar47 = (ulong)uVar45;
              ptr_03 = parasail_memalign_int16_t(0x10,uVar47);
              auVar65._0_4_ = -(uint)((int)ptr_00 == 0);
              auVar65._4_4_ = -(uint)((int)((ulong)ptr_00 >> 0x20) == 0);
              auVar65._8_4_ = -(uint)((int)ptr_01 == 0);
              auVar65._12_4_ = -(uint)((int)((ulong)ptr_01 >> 0x20) == 0);
              auVar58._0_4_ = -(uint)((int)((ulong)ptr >> 0x20) == 0 && (int)ptr == 0);
              auVar58._4_4_ = -(uint)((int)palVar38 == 0 && (int)((ulong)palVar38 >> 0x20) == 0);
              auVar58._8_4_ = auVar65._0_4_ & auVar65._4_4_;
              auVar58._12_4_ = auVar65._8_4_ & auVar65._12_4_;
              iVar46 = movmskps(uVar45,auVar58);
              if (((ptr_02 != (__m128i *)0x0 && palVar39 != (__m128i *)0x0) &&
                  ptr_03 != (int16_t *)0x0) && iVar46 == 0) {
                iVar46 = s2Len + -1;
                auVar58 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
                uVar55 = auVar58._0_4_;
                auVar90._4_4_ = uVar55;
                auVar90._0_4_ = uVar55;
                auVar90._8_4_ = uVar55;
                auVar90._12_4_ = uVar55;
                auVar58 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
                uVar56 = auVar58._0_4_;
                uVar45 = iVar36 - 0x7fff;
                auVar58 = pshuflw(ZEXT416(uVar45),ZEXT416(uVar45),0);
                local_88 = auVar58._0_2_;
                uStack_86 = auVar58._2_2_;
                auVar59 = ZEXT416((uint)CONCAT62((int6)((ulong)unaff_R12 >> 0x10),
                                                 0x7ffe - (short)iVar35));
                auVar59 = pshuflw(auVar59,auVar59,0);
                uVar55 = auVar59._0_4_;
                sVar103 = auVar59._0_2_;
                sVar105 = auVar59._2_2_;
                lVar43 = (long)iVar53;
                for (uVar48 = 0; uVar48 != size; uVar48 = uVar48 + 1) {
                  lVar50 = lVar43;
                  for (lVar51 = 0; lVar51 != 8; lVar51 = lVar51 + 1) {
                    lVar52 = -0x8000;
                    if (-0x8000 < lVar50) {
                      lVar52 = lVar50;
                    }
                    lVar41 = lVar50 - (ulong)(uint)open;
                    if (lVar41 < -0x7fff) {
                      lVar41 = -0x8000;
                    }
                    *(short *)((long)&h + lVar51 * 2) = (short)lVar52;
                    *(short *)((long)&e + lVar51 * 2) = (short)lVar41;
                    lVar50 = lVar50 - size * (uint)gap;
                  }
                  ptr[uVar48][0] = h.m[0];
                  ptr[uVar48][1] = h.m[1];
                  ptr_00[uVar48][0] = e.m[0];
                  ptr_00[uVar48][1] = e.m[1];
                  ptr_01[uVar48][0] = e.m[0];
                  ptr_01[uVar48][1] = e.m[1];
                  lVar43 = lVar43 - (ulong)(uint)gap;
                }
                *ptr_03 = 0;
                for (uVar48 = 1; uVar47 != uVar48; uVar48 = uVar48 + 1) {
                  iVar40 = -0x8000;
                  if (-0x8000 < iVar53) {
                    iVar40 = (int16_t)iVar53;
                  }
                  ptr_03[uVar48] = iVar40;
                  iVar53 = iVar53 - gap;
                }
                lVar50 = size * 0x10;
                for (lVar43 = 0; lVar50 != lVar43; lVar43 = lVar43 + 0x10) {
                  puVar1 = (undefined8 *)((long)((ppVar37->field_4).rowcols)->score_row + lVar43);
                  *puVar1 = 0x8000800080008;
                  puVar1[1] = 0x8000800080008;
                }
                lVar43 = 0;
                uVar47 = 0;
                uVar32 = uVar55;
                uVar33 = uVar55;
                uVar34 = uVar55;
                uVar91 = local_88;
                uVar93 = uStack_86;
                uVar94 = local_88;
                uVar95 = uStack_86;
                uVar96 = local_88;
                uVar97 = uStack_86;
                uVar98 = local_88;
                uVar99 = uStack_86;
                local_f8 = lVar50;
                do {
                  ptr_05 = palVar39;
                  ptr_04 = palVar38;
                  if (uVar47 == (uint)s2Len) {
                    alVar61 = ptr[(ulong)uVar44 % size];
                    iVar35 = 0;
                    while( true ) {
                      uVar47 = alVar61[0];
                      lVar43 = alVar61[1];
                      if (7 - (int)(uVar44 / size) <= iVar35) break;
                      alVar61[0] = uVar47 << 0x10;
                      alVar61[1] = lVar43 << 0x10 | uVar47 >> 0x30;
                      iVar35 = iVar35 + 1;
                    }
                    auVar59._0_2_ = -(ushort)((short)uVar55 < (short)local_88);
                    auVar59._2_2_ = -(ushort)((short)((uint)uVar55 >> 0x10) < (short)uStack_86);
                    auVar59._4_2_ = -(ushort)((short)uVar32 < (short)local_88);
                    auVar59._6_2_ = -(ushort)((short)((uint)uVar32 >> 0x10) < (short)uStack_86);
                    auVar59._8_2_ = -(ushort)((short)uVar33 < (short)local_88);
                    auVar59._10_2_ = -(ushort)((short)((uint)uVar33 >> 0x10) < (short)uStack_86);
                    auVar59._12_2_ = -(ushort)((short)uVar34 < (short)local_88);
                    auVar59._14_2_ = -(ushort)((short)((uint)uVar34 >> 0x10) < (short)uStack_86);
                    auVar92._0_2_ = -(ushort)(sVar103 < (short)uVar91);
                    auVar92._2_2_ = -(ushort)(sVar105 < (short)uVar93);
                    auVar92._4_2_ = -(ushort)(sVar103 < (short)uVar94);
                    auVar92._6_2_ = -(ushort)(sVar105 < (short)uVar95);
                    auVar92._8_2_ = -(ushort)(sVar103 < (short)uVar96);
                    auVar92._10_2_ = -(ushort)(sVar105 < (short)uVar97);
                    auVar92._12_2_ = -(ushort)(sVar103 < (short)uVar98);
                    auVar92._14_2_ = -(ushort)(sVar105 < (short)uVar99);
                    auVar92 = auVar92 | auVar59;
                    if ((((((((((((((((auVar92 >> 7 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0 &&
                                     (auVar92 >> 0xf & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar92 >> 0x17 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar92 >> 0x1f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar92 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar92 >> 0x2f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar92 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar92 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar92 >> 0x47 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar92 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar92 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar92 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar92 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar92 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar92 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        -1 < auVar92[0xf]) {
                      sVar103 = alVar61[1]._6_2_;
                    }
                    else {
                      *(byte *)&ppVar37->flag = (byte)ppVar37->flag | 0x40;
                      sVar103 = 0;
                      iVar46 = 0;
                      uVar44 = 0;
                    }
                    ppVar37->score = (int)sVar103;
                    ppVar37->end_query = uVar44;
                    ppVar37->end_ref = iVar46;
                    parasail_free(ptr_03);
                    parasail_free(ptr_02);
                    parasail_free(ptr_05);
                    parasail_free(ptr_01);
                    parasail_free(ptr_00);
                    parasail_free(ptr_04);
                    parasail_free(ptr);
                    return ppVar37;
                  }
                  uVar48 = ptr[a - 1U][0];
                  auVar117._8_8_ = ptr[a - 1U][1] << 0x10 | uVar48 >> 0x30;
                  auVar117._0_8_ = uVar48 << 0x10 | (ulong)(ushort)ptr_03[uVar47];
                  iVar35 = ppVar6->mapper[(byte)s2[uVar47]] * a;
                  uVar48 = uVar47 + 1;
                  uVar49 = 1;
                  lVar51 = 0;
                  auVar115._4_2_ = local_88;
                  auVar115._0_4_ = auVar58._0_4_;
                  auVar115._6_2_ = uStack_86;
                  auVar115._8_2_ = local_88;
                  auVar115._10_2_ = uStack_86;
                  auVar115._12_2_ = local_88;
                  auVar115._14_2_ = uStack_86;
                  auVar66 = auVar65;
                  while( true ) {
                    sVar113 = (short)((uint)uVar34 >> 0x10);
                    sVar111 = (short)uVar34;
                    sVar110 = (short)((uint)uVar33 >> 0x10);
                    sVar109 = (short)uVar33;
                    sVar107 = (short)((uint)uVar32 >> 0x10);
                    sVar104 = (short)uVar32;
                    sVar102 = (short)((uint)uVar55 >> 0x10);
                    sVar101 = (short)uVar55;
                    if (lVar50 == lVar51) break;
                    auVar65 = *(undefined1 (*) [16])((long)*ptr_00 + lVar51);
                    auVar59 = paddsw(auVar117,*(undefined1 (*) [16])
                                               ((long)pvVar5 + lVar51 + (long)iVar35 * 0x10));
                    sVar8 = auVar65._0_2_;
                    uVar100 = auVar59._0_2_;
                    uVar62 = (ushort)((short)uVar100 < sVar8) * sVar8 |
                             ((short)uVar100 >= sVar8) * uVar100;
                    sVar11 = auVar65._2_2_;
                    uVar106 = auVar59._2_2_;
                    uVar67 = (ushort)((short)uVar106 < sVar11) * sVar11 |
                             ((short)uVar106 >= sVar11) * uVar106;
                    sVar64 = auVar65._4_2_;
                    uVar108 = auVar59._4_2_;
                    uVar70 = (ushort)((short)uVar108 < sVar64) * sVar64 |
                             ((short)uVar108 >= sVar64) * uVar108;
                    sVar78 = auVar65._6_2_;
                    uVar112 = auVar59._6_2_;
                    uVar73 = (ushort)((short)uVar112 < sVar78) * sVar78 |
                             ((short)uVar112 >= sVar78) * uVar112;
                    sVar14 = auVar65._8_2_;
                    uVar76 = auVar59._8_2_;
                    uVar75 = (ushort)((short)uVar76 < sVar14) * sVar14 |
                             ((short)uVar76 >= sVar14) * uVar76;
                    sVar17 = auVar65._10_2_;
                    uVar80 = auVar59._10_2_;
                    uVar79 = (ushort)((short)uVar80 < sVar17) * sVar17 |
                             ((short)uVar80 >= sVar17) * uVar80;
                    sVar20 = auVar65._12_2_;
                    uVar84 = auVar59._12_2_;
                    uVar88 = auVar59._14_2_;
                    uVar83 = (ushort)((short)uVar84 < sVar20) * sVar20 |
                             ((short)uVar84 >= sVar20) * uVar84;
                    sVar23 = auVar65._14_2_;
                    uVar87 = (ushort)((short)uVar88 < sVar23) * sVar23 |
                             ((short)uVar88 >= sVar23) * uVar88;
                    sVar9 = auVar115._0_2_;
                    auVar114._0_2_ =
                         (ushort)((short)uVar62 < sVar9) * sVar9 | ((short)uVar62 >= sVar9) * uVar62
                    ;
                    sVar12 = auVar115._2_2_;
                    auVar114._2_2_ =
                         (ushort)((short)uVar67 < sVar12) * sVar12 |
                         ((short)uVar67 >= sVar12) * uVar67;
                    sVar69 = auVar115._4_2_;
                    auVar114._4_2_ =
                         (ushort)((short)uVar70 < sVar69) * sVar69 |
                         ((short)uVar70 >= sVar69) * uVar70;
                    sVar82 = auVar115._6_2_;
                    auVar114._6_2_ =
                         (ushort)((short)uVar73 < sVar82) * sVar82 |
                         ((short)uVar73 >= sVar82) * uVar73;
                    sVar15 = auVar115._8_2_;
                    auVar114._8_2_ =
                         (ushort)((short)uVar75 < sVar15) * sVar15 |
                         ((short)uVar75 >= sVar15) * uVar75;
                    sVar18 = auVar115._10_2_;
                    auVar114._10_2_ =
                         (ushort)((short)uVar79 < sVar18) * sVar18 |
                         ((short)uVar79 >= sVar18) * uVar79;
                    sVar21 = auVar115._12_2_;
                    auVar114._12_2_ =
                         (ushort)((short)uVar83 < sVar21) * sVar21 |
                         ((short)uVar83 >= sVar21) * uVar83;
                    sVar24 = auVar115._14_2_;
                    auVar114._14_2_ =
                         (ushort)((short)uVar87 < sVar24) * sVar24 |
                         ((short)uVar87 >= sVar24) * uVar87;
                    *(undefined1 (*) [16])((long)*ptr_04 + lVar51) = auVar114;
                    uVar116 = -(ushort)(uVar100 == auVar114._0_2_) & 4 |
                              ~-(ushort)(uVar100 == auVar114._0_2_) & 2 - (sVar9 < (short)uVar62);
                    uVar119 = -(ushort)(uVar106 == auVar114._2_2_) & 4 |
                              ~-(ushort)(uVar106 == auVar114._2_2_) & 2 - (sVar12 < (short)uVar67);
                    uVar120 = -(ushort)(uVar108 == auVar114._4_2_) & 4 |
                              ~-(ushort)(uVar108 == auVar114._4_2_) & 2 - (sVar69 < (short)uVar70);
                    uVar121 = -(ushort)(uVar112 == auVar114._6_2_) & 4 |
                              ~-(ushort)(uVar112 == auVar114._6_2_) & 2 - (sVar82 < (short)uVar73);
                    uVar75 = -(ushort)(uVar76 == auVar114._8_2_) & 4 |
                             ~-(ushort)(uVar76 == auVar114._8_2_) & 2 - (sVar15 < (short)uVar75);
                    uVar76 = -(ushort)(uVar80 == auVar114._10_2_) & 4 |
                             ~-(ushort)(uVar80 == auVar114._10_2_) & 2 - (sVar18 < (short)uVar79);
                    uVar79 = -(ushort)(uVar84 == auVar114._12_2_) & 4 |
                             ~-(ushort)(uVar84 == auVar114._12_2_) & 2 - (sVar21 < (short)uVar83);
                    uVar80 = -(ushort)(uVar88 == auVar114._14_2_) & 4 |
                             ~-(ushort)(uVar88 == auVar114._14_2_) & 2 - (sVar24 < (short)uVar87);
                    puVar2 = (ushort *)
                             ((long)((ppVar37->field_4).rowcols)->score_row + lVar51 + lVar43);
                    uVar100 = *puVar2;
                    uVar62 = puVar2[1];
                    uVar67 = puVar2[2];
                    uVar106 = puVar2[3];
                    uVar108 = puVar2[4];
                    uVar70 = puVar2[5];
                    uVar73 = puVar2[6];
                    uVar112 = puVar2[7];
                    puVar2 = (ushort *)((long)*ptr_02 + lVar51);
                    *puVar2 = uVar116;
                    puVar2[1] = uVar119;
                    puVar2[2] = uVar120;
                    puVar2[3] = uVar121;
                    puVar2[4] = uVar75;
                    puVar2[5] = uVar76;
                    puVar2[6] = uVar79;
                    puVar2[7] = uVar80;
                    puVar2 = (ushort *)
                             ((long)((ppVar37->field_4).rowcols)->score_row + lVar51 + lVar43);
                    *puVar2 = uVar100 | uVar116;
                    puVar2[1] = uVar62 | uVar119;
                    puVar2[2] = uVar67 | uVar120;
                    puVar2[3] = uVar106 | uVar121;
                    puVar2[4] = uVar108 | uVar75;
                    puVar2[5] = uVar70 | uVar76;
                    puVar2[6] = uVar73 | uVar79;
                    puVar2[7] = uVar112 | uVar80;
                    in_XMM11 = psubsw(auVar114,auVar90);
                    auVar26._4_4_ = uVar56;
                    auVar26._0_4_ = uVar56;
                    auVar26._8_4_ = uVar56;
                    auVar26._12_4_ = uVar56;
                    auVar65 = psubsw(auVar65,auVar26);
                    sVar10 = in_XMM11._0_2_;
                    sVar63 = auVar65._0_2_;
                    sVar13 = in_XMM11._2_2_;
                    sVar68 = auVar65._2_2_;
                    sVar72 = in_XMM11._4_2_;
                    sVar71 = auVar65._4_2_;
                    sVar86 = in_XMM11._6_2_;
                    sVar74 = auVar65._6_2_;
                    sVar16 = in_XMM11._8_2_;
                    sVar77 = auVar65._8_2_;
                    sVar19 = in_XMM11._10_2_;
                    sVar81 = auVar65._10_2_;
                    sVar22 = in_XMM11._12_2_;
                    sVar85 = auVar65._12_2_;
                    sVar89 = auVar65._14_2_;
                    sVar25 = in_XMM11._14_2_;
                    puVar2 = (ushort *)((long)*ptr_00 + lVar51);
                    *puVar2 = (ushort)(sVar63 < sVar10) * sVar10 |
                              (ushort)(sVar63 >= sVar10) * sVar63;
                    puVar2[1] = (ushort)(sVar68 < sVar13) * sVar13 |
                                (ushort)(sVar68 >= sVar13) * sVar68;
                    puVar2[2] = (ushort)(sVar71 < sVar72) * sVar72 |
                                (ushort)(sVar71 >= sVar72) * sVar71;
                    puVar2[3] = (ushort)(sVar74 < sVar86) * sVar86 |
                                (ushort)(sVar74 >= sVar86) * sVar74;
                    puVar2[4] = (ushort)(sVar77 < sVar16) * sVar16 |
                                (ushort)(sVar77 >= sVar16) * sVar77;
                    puVar2[5] = (ushort)(sVar81 < sVar19) * sVar19 |
                                (ushort)(sVar81 >= sVar19) * sVar81;
                    puVar2[6] = (ushort)(sVar85 < sVar22) * sVar22 |
                                (ushort)(sVar85 >= sVar22) * sVar85;
                    puVar2[7] = (ushort)(sVar89 < sVar25) * sVar25 |
                                (ushort)(sVar89 >= sVar25) * sVar89;
                    auVar27._4_4_ = uVar56;
                    auVar27._0_4_ = uVar56;
                    auVar27._8_4_ = uVar56;
                    auVar27._12_4_ = uVar56;
                    auVar65 = psubsw(*(undefined1 (*) [16])((long)*ptr_01 + lVar51),auVar27);
                    sVar63 = auVar65._0_2_;
                    sVar68 = auVar65._2_2_;
                    sVar71 = auVar65._4_2_;
                    sVar74 = auVar65._6_2_;
                    sVar77 = auVar65._8_2_;
                    sVar81 = auVar65._10_2_;
                    sVar85 = auVar65._12_2_;
                    sVar89 = auVar65._14_2_;
                    puVar2 = (ushort *)((long)*ptr_05 + lVar51);
                    *puVar2 = (ushort)(sVar10 < sVar63) * sVar63 |
                              (ushort)(sVar10 >= sVar63) * sVar10;
                    puVar2[1] = (ushort)(sVar13 < sVar68) * sVar68 |
                                (ushort)(sVar13 >= sVar68) * sVar13;
                    puVar2[2] = (ushort)(sVar72 < sVar71) * sVar71 |
                                (ushort)(sVar72 >= sVar71) * sVar72;
                    puVar2[3] = (ushort)(sVar86 < sVar74) * sVar74 |
                                (ushort)(sVar86 >= sVar74) * sVar86;
                    puVar2[4] = (ushort)(sVar16 < sVar77) * sVar77 |
                                (ushort)(sVar16 >= sVar77) * sVar16;
                    puVar2[5] = (ushort)(sVar19 < sVar81) * sVar81 |
                                (ushort)(sVar19 >= sVar81) * sVar19;
                    puVar2[6] = (ushort)(sVar22 < sVar85) * sVar85 |
                                (ushort)(sVar22 >= sVar85) * sVar22;
                    puVar2[7] = (ushort)(sVar25 < sVar89) * sVar89 |
                                (ushort)(sVar25 >= sVar89) * sVar25;
                    if ((int)uVar48 < s2Len) {
                      puVar2 = (ushort *)
                               ((long)((ppVar37->field_4).rowcols)->score_row + lVar51 + local_f8);
                      *puVar2 = -(ushort)(sVar63 < sVar10) & 0x18 ^ 0x10;
                      puVar2[1] = -(ushort)(sVar68 < sVar13) & 0x18 ^ 0x10;
                      puVar2[2] = -(ushort)(sVar71 < sVar72) & 0x18 ^ 0x10;
                      puVar2[3] = -(ushort)(sVar74 < sVar86) & 0x18 ^ 0x10;
                      puVar2[4] = -(ushort)(sVar77 < sVar16) & 0x18 ^ 0x10;
                      puVar2[5] = -(ushort)(sVar81 < sVar19) & 0x18 ^ 0x10;
                      puVar2[6] = -(ushort)(sVar85 < sVar22) & 0x18 ^ 0x10;
                      puVar2[7] = -(ushort)(sVar89 < sVar25) & 0x18 ^ 0x10;
                    }
                    auVar28._4_4_ = uVar56;
                    auVar28._0_4_ = uVar56;
                    auVar28._8_4_ = uVar56;
                    auVar28._12_4_ = uVar56;
                    auVar66 = psubsw(auVar115,auVar28);
                    sVar63 = auVar66._0_2_;
                    sVar68 = auVar66._2_2_;
                    sVar71 = auVar66._4_2_;
                    sVar74 = auVar66._6_2_;
                    sVar77 = auVar66._8_2_;
                    sVar81 = auVar66._10_2_;
                    sVar85 = auVar66._12_2_;
                    sVar89 = auVar66._14_2_;
                    if (uVar49 < size) {
                      piVar7 = ((ppVar37->field_4).rowcols)->score_row;
                      puVar2 = (ushort *)((long)piVar7 + lVar51 + 0x10 + lVar43);
                      uVar100 = puVar2[1];
                      uVar62 = puVar2[2];
                      uVar67 = puVar2[3];
                      uVar106 = puVar2[4];
                      uVar108 = puVar2[5];
                      uVar70 = puVar2[6];
                      uVar73 = puVar2[7];
                      puVar3 = (ushort *)((long)piVar7 + lVar51 + 0x10 + lVar43);
                      *puVar3 = -(ushort)(sVar63 < sVar10) & 0x60 ^ 0x40 | *puVar2;
                      puVar3[1] = -(ushort)(sVar68 < sVar13) & 0x60 ^ 0x40 | uVar100;
                      puVar3[2] = -(ushort)(sVar71 < sVar72) & 0x60 ^ 0x40 | uVar62;
                      puVar3[3] = -(ushort)(sVar74 < sVar86) & 0x60 ^ 0x40 | uVar67;
                      puVar3[4] = -(ushort)(sVar77 < sVar16) & 0x60 ^ 0x40 | uVar106;
                      puVar3[5] = -(ushort)(sVar81 < sVar19) & 0x60 ^ 0x40 | uVar108;
                      puVar3[6] = -(ushort)(sVar85 < sVar22) & 0x60 ^ 0x40 | uVar70;
                      puVar3[7] = -(ushort)(sVar89 < sVar25) & 0x60 ^ 0x40 | uVar73;
                    }
                    uVar91 = ((short)uVar91 < (short)auVar114._0_2_) * auVar114._0_2_ |
                             ((short)uVar91 >= (short)auVar114._0_2_) * uVar91;
                    uVar93 = ((short)uVar93 < (short)auVar114._2_2_) * auVar114._2_2_ |
                             ((short)uVar93 >= (short)auVar114._2_2_) * uVar93;
                    uVar94 = ((short)uVar94 < (short)auVar114._4_2_) * auVar114._4_2_ |
                             ((short)uVar94 >= (short)auVar114._4_2_) * uVar94;
                    uVar95 = ((short)uVar95 < (short)auVar114._6_2_) * auVar114._6_2_ |
                             ((short)uVar95 >= (short)auVar114._6_2_) * uVar95;
                    uVar96 = ((short)uVar96 < (short)auVar114._8_2_) * auVar114._8_2_ |
                             ((short)uVar96 >= (short)auVar114._8_2_) * uVar96;
                    uVar97 = ((short)uVar97 < (short)auVar114._10_2_) * auVar114._10_2_ |
                             ((short)uVar97 >= (short)auVar114._10_2_) * uVar97;
                    uVar98 = ((short)uVar98 < (short)auVar114._12_2_) * auVar114._12_2_ |
                             ((short)uVar98 >= (short)auVar114._12_2_) * uVar98;
                    uVar99 = ((short)uVar99 < (short)auVar114._14_2_) * auVar114._14_2_ |
                             ((short)uVar99 >= (short)auVar114._14_2_) * uVar99;
                    uVar100 = (ushort)(sVar8 < sVar101) * sVar8 |
                              (ushort)(sVar8 >= sVar101) * sVar101;
                    uVar62 = (ushort)(sVar11 < sVar102) * sVar11 |
                             (ushort)(sVar11 >= sVar102) * sVar102;
                    uVar67 = (ushort)(sVar64 < sVar104) * sVar64 |
                             (ushort)(sVar64 >= sVar104) * sVar104;
                    uVar106 = (ushort)(sVar78 < sVar107) * sVar78 |
                              (ushort)(sVar78 >= sVar107) * sVar107;
                    uVar108 = (ushort)(sVar14 < sVar109) * sVar14 |
                              (ushort)(sVar14 >= sVar109) * sVar109;
                    uVar70 = (ushort)(sVar17 < sVar110) * sVar17 |
                             (ushort)(sVar17 >= sVar110) * sVar110;
                    uVar73 = (ushort)(sVar20 < sVar111) * sVar20 |
                             (ushort)(sVar20 >= sVar111) * sVar111;
                    uVar112 = (ushort)(sVar23 < sVar113) * sVar23 |
                              (ushort)(sVar23 >= sVar113) * sVar113;
                    uVar100 = (ushort)(sVar9 < (short)uVar100) * sVar9 |
                              (sVar9 >= (short)uVar100) * uVar100;
                    uVar62 = (ushort)(sVar12 < (short)uVar62) * sVar12 |
                             (sVar12 >= (short)uVar62) * uVar62;
                    uVar67 = (ushort)(sVar69 < (short)uVar67) * sVar69 |
                             (sVar69 >= (short)uVar67) * uVar67;
                    uVar106 = (ushort)(sVar82 < (short)uVar106) * sVar82 |
                              (sVar82 >= (short)uVar106) * uVar106;
                    uVar108 = (ushort)(sVar15 < (short)uVar108) * sVar15 |
                              (sVar15 >= (short)uVar108) * uVar108;
                    uVar70 = (ushort)(sVar18 < (short)uVar70) * sVar18 |
                             (sVar18 >= (short)uVar70) * uVar70;
                    uVar73 = (ushort)(sVar21 < (short)uVar73) * sVar21 |
                             (sVar21 >= (short)uVar73) * uVar73;
                    uVar112 = (ushort)(sVar24 < (short)uVar112) * sVar24 |
                              (sVar24 >= (short)uVar112) * uVar112;
                    uVar55 = CONCAT22(((short)auVar114._2_2_ < (short)uVar62) * auVar114._2_2_ |
                                      ((short)auVar114._2_2_ >= (short)uVar62) * uVar62,
                                      ((short)auVar114._0_2_ < (short)uVar100) * auVar114._0_2_ |
                                      ((short)auVar114._0_2_ >= (short)uVar100) * uVar100);
                    uVar32 = CONCAT22(((short)auVar114._6_2_ < (short)uVar106) * auVar114._6_2_ |
                                      ((short)auVar114._6_2_ >= (short)uVar106) * uVar106,
                                      ((short)auVar114._4_2_ < (short)uVar67) * auVar114._4_2_ |
                                      ((short)auVar114._4_2_ >= (short)uVar67) * uVar67);
                    uVar33 = CONCAT22(((short)auVar114._10_2_ < (short)uVar70) * auVar114._10_2_ |
                                      ((short)auVar114._10_2_ >= (short)uVar70) * uVar70,
                                      ((short)auVar114._8_2_ < (short)uVar108) * auVar114._8_2_ |
                                      ((short)auVar114._8_2_ >= (short)uVar108) * uVar108);
                    uVar34 = CONCAT22(((short)auVar114._14_2_ < (short)uVar112) * auVar114._14_2_ |
                                      ((short)auVar114._14_2_ >= (short)uVar112) * uVar112,
                                      ((short)auVar114._12_2_ < (short)uVar73) * auVar114._12_2_ |
                                      ((short)auVar114._12_2_ >= (short)uVar73) * uVar73);
                    auVar115._0_2_ =
                         (ushort)(sVar10 < sVar63) * sVar63 | (ushort)(sVar10 >= sVar63) * sVar10;
                    auVar115._2_2_ =
                         (ushort)(sVar13 < sVar68) * sVar68 | (ushort)(sVar13 >= sVar68) * sVar13;
                    auVar115._4_2_ =
                         (ushort)(sVar72 < sVar71) * sVar71 | (ushort)(sVar72 >= sVar71) * sVar72;
                    auVar115._6_2_ =
                         (ushort)(sVar86 < sVar74) * sVar74 | (ushort)(sVar86 >= sVar74) * sVar86;
                    auVar115._8_2_ =
                         (ushort)(sVar16 < sVar77) * sVar77 | (ushort)(sVar16 >= sVar77) * sVar16;
                    auVar115._10_2_ =
                         (ushort)(sVar19 < sVar81) * sVar81 | (ushort)(sVar19 >= sVar81) * sVar19;
                    auVar115._12_2_ =
                         (ushort)(sVar22 < sVar85) * sVar85 | (ushort)(sVar22 >= sVar85) * sVar22;
                    auVar115._14_2_ =
                         (ushort)(sVar25 < sVar89) * sVar89 | (ushort)(sVar25 >= sVar89) * sVar25;
                    auVar117 = *(undefined1 (*) [16])((long)*ptr + lVar51);
                    lVar51 = lVar51 + 0x10;
                    uVar49 = uVar49 + 1;
                  }
                  auVar65 = auVar66;
                  auVar59 = auVar115;
                  for (iVar36 = 0; iVar36 != 8; iVar36 = iVar36 + 1) {
                    uVar49 = (ulong)(uint)(ptr_03[uVar48] - open);
                    if (ptr_03[uVar48] - open < -0x7fff) {
                      uVar49 = 0xffff8000;
                    }
                    uVar57 = ptr[a - 1U][0];
                    auVar118._8_8_ = ptr[a - 1U][1] << 0x10 | uVar57 >> 0x30;
                    auVar118._0_8_ = uVar57 << 0x10 | (ulong)(ushort)ptr_03[uVar47];
                    uVar57 = in_XMM11._0_8_;
                    in_XMM11._8_8_ = in_XMM11._8_8_ << 0x10 | uVar57 >> 0x30;
                    in_XMM11._0_8_ = uVar57 << 0x10 | uVar49 & 0xffff;
                    uVar57 = auVar65._0_8_;
                    auVar65._8_8_ = auVar65._8_8_ << 0x10 | uVar57 >> 0x30;
                    auVar65._0_8_ = uVar57 << 0x10 | (ulong)(ushort)uVar45;
                    auVar123._8_8_ = auVar59._8_8_ << 0x10 | auVar59._0_8_ >> 0x30;
                    auVar123._0_8_ = auVar59._0_8_ << 0x10 | uVar49 & 0xffff;
                    uVar57 = auVar66._0_8_;
                    auVar66._8_8_ = auVar66._8_8_ << 0x10 | uVar57 >> 0x30;
                    auVar66._0_8_ = uVar57 << 0x10 | (ulong)(ushort)uVar45;
                    uVar57 = auVar115._0_8_;
                    auVar115._8_8_ = auVar115._8_8_ << 0x10 | uVar57 >> 0x30;
                    auVar115._0_8_ = uVar57 << 0x10 | uVar49 & 0xffff;
                    lVar52 = 0;
                    uVar49 = size;
                    lVar51 = lVar43;
                    auVar59 = auVar123;
                    while( true ) {
                      sVar113 = (short)((uint)uVar34 >> 0x10);
                      sVar111 = (short)uVar34;
                      sVar110 = (short)((uint)uVar33 >> 0x10);
                      sVar109 = (short)uVar33;
                      sVar107 = (short)((uint)uVar32 >> 0x10);
                      sVar104 = (short)uVar32;
                      sVar102 = (short)((uint)uVar55 >> 0x10);
                      sVar101 = (short)uVar55;
                      bVar54 = uVar49 == 0;
                      uVar49 = uVar49 - 1;
                      if (bVar54) break;
                      psVar4 = (short *)((long)*ptr_04 + lVar52);
                      sVar64 = *psVar4;
                      sVar69 = psVar4[1];
                      sVar72 = psVar4[2];
                      sVar71 = psVar4[3];
                      sVar78 = psVar4[4];
                      sVar82 = psVar4[5];
                      sVar86 = psVar4[6];
                      sVar74 = psVar4[7];
                      sVar8 = auVar59._0_2_;
                      auVar122._0_2_ =
                           (ushort)(sVar64 < sVar8) * sVar8 | (ushort)(sVar64 >= sVar8) * sVar64;
                      sVar9 = auVar59._2_2_;
                      auVar122._2_2_ =
                           (ushort)(sVar69 < sVar9) * sVar9 | (ushort)(sVar69 >= sVar9) * sVar69;
                      sVar10 = auVar59._4_2_;
                      auVar122._4_2_ =
                           (ushort)(sVar72 < sVar10) * sVar10 | (ushort)(sVar72 >= sVar10) * sVar72;
                      sVar63 = auVar59._6_2_;
                      auVar122._6_2_ =
                           (ushort)(sVar71 < sVar63) * sVar63 | (ushort)(sVar71 >= sVar63) * sVar71;
                      sVar11 = auVar59._8_2_;
                      auVar122._8_2_ =
                           (ushort)(sVar78 < sVar11) * sVar11 | (ushort)(sVar78 >= sVar11) * sVar78;
                      sVar12 = auVar59._10_2_;
                      auVar122._10_2_ =
                           (ushort)(sVar82 < sVar12) * sVar12 | (ushort)(sVar82 >= sVar12) * sVar82;
                      sVar13 = auVar59._12_2_;
                      auVar122._12_2_ =
                           (ushort)(sVar86 < sVar13) * sVar13 | (ushort)(sVar86 >= sVar13) * sVar86;
                      sVar68 = auVar59._14_2_;
                      auVar122._14_2_ =
                           (ushort)(sVar74 < sVar68) * sVar68 | (ushort)(sVar74 >= sVar68) * sVar74;
                      *(undefined1 (*) [16])((long)*ptr_04 + lVar52) = auVar122;
                      auVar65 = paddsw(auVar118,*(undefined1 (*) [16])
                                                 ((long)pvVar5 + lVar52 + (long)iVar35 * 0x10));
                      uVar75 = -(ushort)(sVar8 < sVar64 || auVar65._0_2_ == auVar122._0_2_);
                      uVar76 = -(ushort)(sVar9 < sVar69 || auVar65._2_2_ == auVar122._2_2_);
                      uVar79 = -(ushort)(sVar10 < sVar72 || auVar65._4_2_ == auVar122._4_2_);
                      uVar80 = -(ushort)(sVar63 < sVar71 || auVar65._6_2_ == auVar122._6_2_);
                      uVar84 = -(ushort)(sVar11 < sVar78 || auVar65._8_2_ == auVar122._8_2_);
                      uVar83 = -(ushort)(sVar12 < sVar82 || auVar65._10_2_ == auVar122._10_2_);
                      uVar88 = -(ushort)(sVar13 < sVar86 || auVar65._12_2_ == auVar122._12_2_);
                      uVar87 = -(ushort)(sVar68 < sVar74 || auVar65._14_2_ == auVar122._14_2_);
                      puVar2 = (ushort *)((long)((ppVar37->field_4).rowcols)->score_row + lVar51);
                      uVar100 = *puVar2;
                      uVar62 = puVar2[1];
                      uVar67 = puVar2[2];
                      uVar106 = puVar2[3];
                      uVar108 = puVar2[4];
                      uVar70 = puVar2[5];
                      uVar73 = puVar2[6];
                      uVar112 = puVar2[7];
                      puVar2 = (ushort *)((long)*ptr_02 + lVar52);
                      uVar75 = ~uVar75 & 2 | *puVar2 & uVar75;
                      uVar76 = ~uVar76 & 2 | puVar2[1] & uVar76;
                      uVar79 = ~uVar79 & 2 | puVar2[2] & uVar79;
                      uVar80 = ~uVar80 & 2 | puVar2[3] & uVar80;
                      uVar84 = ~uVar84 & 2 | puVar2[4] & uVar84;
                      uVar83 = ~uVar83 & 2 | puVar2[5] & uVar83;
                      uVar88 = ~uVar88 & 2 | puVar2[6] & uVar88;
                      uVar87 = ~uVar87 & 2 | puVar2[7] & uVar87;
                      puVar2 = (ushort *)((long)*ptr_02 + lVar52);
                      *puVar2 = uVar75;
                      puVar2[1] = uVar76;
                      puVar2[2] = uVar79;
                      puVar2[3] = uVar80;
                      puVar2[4] = uVar84;
                      puVar2[5] = uVar83;
                      puVar2[6] = uVar88;
                      puVar2[7] = uVar87;
                      puVar2 = (ushort *)((long)((ppVar37->field_4).rowcols)->score_row + lVar51);
                      *puVar2 = uVar75 | uVar100 & 0x78;
                      puVar2[1] = uVar76 | uVar62 & 0x78;
                      puVar2[2] = uVar79 | uVar67 & 0x78;
                      puVar2[3] = uVar80 | uVar106 & 0x78;
                      puVar2[4] = uVar84 | uVar108 & 0x78;
                      puVar2[5] = uVar83 | uVar70 & 0x78;
                      puVar2[6] = uVar88 | uVar73 & 0x78;
                      puVar2[7] = uVar87 | uVar112 & 0x78;
                      piVar7 = ((ppVar37->field_4).rowcols)->score_row;
                      puVar2 = (ushort *)((long)piVar7 + lVar51);
                      uVar100 = puVar2[1];
                      uVar62 = puVar2[2];
                      uVar67 = puVar2[3];
                      uVar106 = puVar2[4];
                      uVar108 = puVar2[5];
                      uVar70 = puVar2[6];
                      uVar73 = puVar2[7];
                      puVar3 = (ushort *)((long)piVar7 + lVar51);
                      *puVar3 = (*puVar2 & 0x1f | -(ushort)(auVar66._0_2_ < in_XMM11._0_2_) & 0x60)
                                ^ 0x40;
                      puVar3[1] = (uVar100 & 0x1f | -(ushort)(auVar66._2_2_ < in_XMM11._2_2_) & 0x60
                                  ) ^ 0x40;
                      puVar3[2] = (uVar62 & 0x1f | -(ushort)(auVar66._4_2_ < in_XMM11._4_2_) & 0x60)
                                  ^ 0x40;
                      puVar3[3] = (uVar67 & 0x1f | -(ushort)(auVar66._6_2_ < in_XMM11._6_2_) & 0x60)
                                  ^ 0x40;
                      puVar3[4] = (uVar106 & 0x1f | -(ushort)(auVar66._8_2_ < in_XMM11._8_2_) & 0x60
                                  ) ^ 0x40;
                      puVar3[5] = (uVar108 & 0x1f |
                                  -(ushort)(auVar66._10_2_ < in_XMM11._10_2_) & 0x60) ^ 0x40;
                      puVar3[6] = (uVar70 & 0x1f |
                                  -(ushort)(auVar66._12_2_ < in_XMM11._12_2_) & 0x60) ^ 0x40;
                      puVar3[7] = (uVar73 & 0x1f |
                                  -(ushort)(auVar66._14_2_ < in_XMM11._14_2_) & 0x60) ^ 0x40;
                      in_XMM11 = psubsw(auVar122,auVar90);
                      auVar29._4_4_ = uVar56;
                      auVar29._0_4_ = uVar56;
                      auVar29._8_4_ = uVar56;
                      auVar29._12_4_ = uVar56;
                      auVar65 = psubsw(*(undefined1 (*) [16])((long)*ptr_01 + lVar52),auVar29);
                      sVar8 = auVar65._0_2_;
                      sVar64 = in_XMM11._0_2_;
                      sVar9 = auVar65._2_2_;
                      sVar69 = in_XMM11._2_2_;
                      sVar10 = auVar65._4_2_;
                      sVar72 = in_XMM11._4_2_;
                      sVar63 = auVar65._6_2_;
                      sVar71 = in_XMM11._6_2_;
                      sVar11 = auVar65._8_2_;
                      sVar78 = in_XMM11._8_2_;
                      sVar12 = auVar65._10_2_;
                      sVar82 = in_XMM11._10_2_;
                      sVar13 = auVar65._12_2_;
                      sVar86 = in_XMM11._12_2_;
                      sVar74 = in_XMM11._14_2_;
                      sVar68 = auVar65._14_2_;
                      puVar2 = (ushort *)((long)*ptr_05 + lVar52);
                      *puVar2 = (ushort)(sVar64 < sVar8) * sVar8 |
                                (ushort)(sVar64 >= sVar8) * sVar64;
                      puVar2[1] = (ushort)(sVar69 < sVar9) * sVar9 |
                                  (ushort)(sVar69 >= sVar9) * sVar69;
                      puVar2[2] = (ushort)(sVar72 < sVar10) * sVar10 |
                                  (ushort)(sVar72 >= sVar10) * sVar72;
                      puVar2[3] = (ushort)(sVar71 < sVar63) * sVar63 |
                                  (ushort)(sVar71 >= sVar63) * sVar71;
                      puVar2[4] = (ushort)(sVar78 < sVar11) * sVar11 |
                                  (ushort)(sVar78 >= sVar11) * sVar78;
                      puVar2[5] = (ushort)(sVar82 < sVar12) * sVar12 |
                                  (ushort)(sVar82 >= sVar12) * sVar82;
                      puVar2[6] = (ushort)(sVar86 < sVar13) * sVar13 |
                                  (ushort)(sVar86 >= sVar13) * sVar86;
                      puVar2[7] = (ushort)(sVar74 < sVar68) * sVar68 |
                                  (ushort)(sVar74 >= sVar68) * sVar74;
                      if ((int)uVar48 < s2Len) {
                        puVar2 = (ushort *)
                                 ((long)((ppVar37->field_4).rowcols)->score_row + lVar51 + lVar50);
                        *puVar2 = -(ushort)(sVar8 < sVar64) & 0x18 ^ 0x10;
                        puVar2[1] = -(ushort)(sVar9 < sVar69) & 0x18 ^ 0x10;
                        puVar2[2] = -(ushort)(sVar10 < sVar72) & 0x18 ^ 0x10;
                        puVar2[3] = -(ushort)(sVar63 < sVar71) & 0x18 ^ 0x10;
                        puVar2[4] = -(ushort)(sVar11 < sVar78) & 0x18 ^ 0x10;
                        puVar2[5] = -(ushort)(sVar12 < sVar82) & 0x18 ^ 0x10;
                        puVar2[6] = -(ushort)(sVar13 < sVar86) & 0x18 ^ 0x10;
                        puVar2[7] = -(ushort)(sVar68 < sVar74) & 0x18 ^ 0x10;
                      }
                      uVar55 = CONCAT22(((short)auVar122._2_2_ < sVar102) * auVar122._2_2_ |
                                        (ushort)((short)auVar122._2_2_ >= sVar102) * sVar102,
                                        ((short)auVar122._0_2_ < sVar101) * auVar122._0_2_ |
                                        (ushort)((short)auVar122._0_2_ >= sVar101) * sVar101);
                      uVar32 = CONCAT22(((short)auVar122._6_2_ < sVar107) * auVar122._6_2_ |
                                        (ushort)((short)auVar122._6_2_ >= sVar107) * sVar107,
                                        ((short)auVar122._4_2_ < sVar104) * auVar122._4_2_ |
                                        (ushort)((short)auVar122._4_2_ >= sVar104) * sVar104);
                      uVar33 = CONCAT22(((short)auVar122._10_2_ < sVar110) * auVar122._10_2_ |
                                        (ushort)((short)auVar122._10_2_ >= sVar110) * sVar110,
                                        ((short)auVar122._8_2_ < sVar109) * auVar122._8_2_ |
                                        (ushort)((short)auVar122._8_2_ >= sVar109) * sVar109);
                      uVar34 = CONCAT22(((short)auVar122._14_2_ < sVar113) * auVar122._14_2_ |
                                        (ushort)((short)auVar122._14_2_ >= sVar113) * sVar113,
                                        ((short)auVar122._12_2_ < sVar111) * auVar122._12_2_ |
                                        (ushort)((short)auVar122._12_2_ >= sVar111) * sVar111);
                      uVar91 = ((short)uVar91 < (short)auVar122._0_2_) * auVar122._0_2_ |
                               ((short)uVar91 >= (short)auVar122._0_2_) * uVar91;
                      uVar93 = ((short)uVar93 < (short)auVar122._2_2_) * auVar122._2_2_ |
                               ((short)uVar93 >= (short)auVar122._2_2_) * uVar93;
                      uVar94 = ((short)uVar94 < (short)auVar122._4_2_) * auVar122._4_2_ |
                               ((short)uVar94 >= (short)auVar122._4_2_) * uVar94;
                      uVar95 = ((short)uVar95 < (short)auVar122._6_2_) * auVar122._6_2_ |
                               ((short)uVar95 >= (short)auVar122._6_2_) * uVar95;
                      uVar96 = ((short)uVar96 < (short)auVar122._8_2_) * auVar122._8_2_ |
                               ((short)uVar96 >= (short)auVar122._8_2_) * uVar96;
                      uVar97 = ((short)uVar97 < (short)auVar122._10_2_) * auVar122._10_2_ |
                               ((short)uVar97 >= (short)auVar122._10_2_) * uVar97;
                      uVar98 = ((short)uVar98 < (short)auVar122._12_2_) * auVar122._12_2_ |
                               ((short)uVar98 >= (short)auVar122._12_2_) * uVar98;
                      uVar99 = ((short)uVar99 < (short)auVar122._14_2_) * auVar122._14_2_ |
                               ((short)uVar99 >= (short)auVar122._14_2_) * uVar99;
                      auVar30._4_4_ = uVar56;
                      auVar30._0_4_ = uVar56;
                      auVar30._8_4_ = uVar56;
                      auVar30._12_4_ = uVar56;
                      auVar65 = psubsw(auVar59,auVar30);
                      auVar60._0_2_ = -(ushort)(auVar65._0_2_ < sVar64);
                      auVar60._2_2_ = -(ushort)(auVar65._2_2_ < sVar69);
                      auVar60._4_2_ = -(ushort)(auVar65._4_2_ < sVar72);
                      auVar60._6_2_ = -(ushort)(auVar65._6_2_ < sVar71);
                      auVar60._8_2_ = -(ushort)(auVar65._8_2_ < sVar78);
                      auVar60._10_2_ = -(ushort)(auVar65._10_2_ < sVar82);
                      auVar60._12_2_ = -(ushort)(auVar65._12_2_ < sVar86);
                      auVar60._14_2_ = -(ushort)(auVar65._14_2_ < sVar74);
                      if ((ushort)((ushort)(SUB161(auVar60 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar60 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar60 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar60 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar60 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar60 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar60 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar60 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar60 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar60 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar60 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar60 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar60 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar60 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)((byte)(auVar60._14_2_ >> 7) & 1) << 0xe |
                                  auVar60._14_2_ & 0x8000) == 0xffff) goto LAB_0060f90a;
                      auVar31._4_4_ = uVar56;
                      auVar31._0_4_ = uVar56;
                      auVar31._8_4_ = uVar56;
                      auVar31._12_4_ = uVar56;
                      auVar66 = psubsw(auVar115,auVar31);
                      sVar101 = auVar66._0_2_;
                      auVar115._0_2_ =
                           (ushort)(sVar64 < sVar101) * sVar101 |
                           (ushort)(sVar64 >= sVar101) * sVar64;
                      sVar101 = auVar66._2_2_;
                      auVar115._2_2_ =
                           (ushort)(sVar69 < sVar101) * sVar101 |
                           (ushort)(sVar69 >= sVar101) * sVar69;
                      sVar101 = auVar66._4_2_;
                      auVar115._4_2_ =
                           (ushort)(sVar72 < sVar101) * sVar101 |
                           (ushort)(sVar72 >= sVar101) * sVar72;
                      sVar101 = auVar66._6_2_;
                      auVar115._6_2_ =
                           (ushort)(sVar71 < sVar101) * sVar101 |
                           (ushort)(sVar71 >= sVar101) * sVar71;
                      sVar101 = auVar66._8_2_;
                      auVar115._8_2_ =
                           (ushort)(sVar78 < sVar101) * sVar101 |
                           (ushort)(sVar78 >= sVar101) * sVar78;
                      sVar101 = auVar66._10_2_;
                      auVar115._10_2_ =
                           (ushort)(sVar82 < sVar101) * sVar101 |
                           (ushort)(sVar82 >= sVar101) * sVar82;
                      sVar101 = auVar66._12_2_;
                      auVar115._12_2_ =
                           (ushort)(sVar86 < sVar101) * sVar101 |
                           (ushort)(sVar86 >= sVar101) * sVar86;
                      sVar101 = auVar66._14_2_;
                      auVar115._14_2_ =
                           (ushort)(sVar74 < sVar101) * sVar101 |
                           (ushort)(sVar74 >= sVar101) * sVar74;
                      auVar118 = *(undefined1 (*) [16])((long)*ptr + lVar52);
                      lVar51 = lVar51 + 0x10;
                      lVar52 = lVar52 + 0x10;
                      auVar59 = auVar65;
                    }
                  }
LAB_0060f90a:
                  local_f8 = local_f8 + lVar50;
                  lVar43 = lVar43 + lVar50;
                  palVar38 = ptr;
                  palVar39 = ptr_01;
                  uVar47 = uVar48;
                  ptr_01 = ptr_05;
                  ptr = ptr_04;
                } while( true );
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar42 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_nw_trace_striped_profile_sse2_128_16",pcVar42);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEaStore = NULL;
    __m128i* restrict pvEaLoad = NULL;
    __m128i* restrict pvHT = NULL;
    int16_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;
    __m128i vTIns;
    __m128i vTDel;
    __m128i vTDiag;
    __m128i vTDiagE;
    __m128i vTInsE;
    __m128i vTDiagF;
    __m128i vTDelF;
    __m128i vTMask;
    __m128i vFTMask;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vTIns  = _mm_set1_epi16(PARASAIL_INS);
    vTDel  = _mm_set1_epi16(PARASAIL_DEL);
    vTDiag = _mm_set1_epi16(PARASAIL_DIAG);
    vTDiagE = _mm_set1_epi16(PARASAIL_DIAG_E);
    vTInsE = _mm_set1_epi16(PARASAIL_INS_E);
    vTDiagF = _mm_set1_epi16(PARASAIL_DIAG_F);
    vTDelF = _mm_set1_epi16(PARASAIL_DEL_F);
    vTMask = _mm_set1_epi16(PARASAIL_ZERO_MASK);
    vFTMask = _mm_set1_epi16(PARASAIL_F_MASK);

    /* initialize result */
    result = parasail_result_new_trace(segLen, s2Len, 16, sizeof(__m128i));
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_TRACE
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad = parasail_memalign___m128i(16, segLen);
    pvE = parasail_memalign___m128i(16, segLen);
    pvEaStore = parasail_memalign___m128i(16, segLen);
    pvEaLoad = parasail_memalign___m128i(16, segLen);
    pvHT = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEaStore) return NULL;
    if (!pvEaLoad) return NULL;
    if (!pvHT) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            _mm_store_si128(&pvEaStore[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    for (i=0; i<segLen; ++i) {
        arr_store(result->trace->trace_table, vTDiagE, i, segLen, 0);
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFa;
        __m128i vFa_ext;
        __m128i vH;
        __m128i vH_dag;
        const __m128i* vP = NULL;

        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 2);

        /* insert upper boundary condition */
        vH = _mm_insert_epi16(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad, pvHStore)
        SWAP(pvEaLoad, pvEaStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_adds_epi16(vH, _mm_load_si128(vP + i));
            vH = _mm_max_epi16(vH_dag, vE);
            vH = _mm_max_epi16(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vF);

            {
                __m128i vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                __m128i case1 = _mm_cmpeq_epi16(vH, vH_dag);
                __m128i case2 = _mm_cmpeq_epi16(vH, vF);
                __m128i vT = _mm_blendv_epi8_rpl(
                        _mm_blendv_epi8_rpl(vTIns, vTDel, case2),
                        vTDiag, case1);
                _mm_store_si128(pvHT + i, vT);
                vT = _mm_or_si128(vT, vTAll);
                arr_store(result->trace->trace_table, vT, i, segLen, j);
            }

            vEF_opn = _mm_subs_epi16(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_subs_epi16(vE, vGapE);
            vE = _mm_max_epi16(vEF_opn, vE_ext);
            _mm_store_si128(pvE + i, vE);
            {
                __m128i vEa = _mm_load_si128(pvEaLoad + i);
                __m128i vEa_ext = _mm_subs_epi16(vEa, vGapE);
                vEa = _mm_max_epi16(vEF_opn, vEa_ext);
                _mm_store_si128(pvEaStore + i, vEa);
                if (j+1<s2Len) {
                    __m128i cond = _mm_cmpgt_epi16(vEF_opn, vEa_ext);
                    __m128i vT = _mm_blendv_epi8_rpl(vTInsE, vTDiagE, cond);
                    arr_store(result->trace->trace_table, vT, i, segLen, j+1);
                }
            }

            /* Update vF value. */
            vF_ext = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vEF_opn, vF_ext);
            if (i+1<segLen) {
                __m128i vTAll = arr_load(result->trace->trace_table, i+1, segLen, j);
                __m128i cond = _mm_cmpgt_epi16(vEF_opn, vF_ext);
                __m128i vT = _mm_blendv_epi8_rpl(vTDelF, vTDiagF, cond);
                vT = _mm_or_si128(vT, vTAll);
                arr_store(result->trace->trace_table, vT, i+1, segLen, j);
            }

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }


        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        vFa_ext = vF_ext;
        vFa = vF;
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = boundary[j+1]-open;
            int16_t tmp2 = tmp < INT16_MIN ? INT16_MIN : tmp;
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            vHp = _mm_slli_si128(vHp, 2);
            vHp = _mm_insert_epi16(vHp, boundary[j], 0);
            vEF_opn = _mm_slli_si128(vEF_opn, 2);
            vEF_opn = _mm_insert_epi16(vEF_opn, tmp2, 0);
            vF_ext = _mm_slli_si128(vF_ext, 2);
            vF_ext = _mm_insert_epi16(vF_ext, NEG_LIMIT, 0);
            vF = _mm_slli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, tmp2, 0);
            vFa_ext = _mm_slli_si128(vFa_ext, 2);
            vFa_ext = _mm_insert_epi16(vFa_ext, NEG_LIMIT, 0);
            vFa = _mm_slli_si128(vFa, 2);
            vFa = _mm_insert_epi16(vFa, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi16(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
                {
                    __m128i vTAll;
                    __m128i vT;
                    __m128i case1;
                    __m128i case2;
                    __m128i cond;
                    vHp = _mm_adds_epi16(vHp, _mm_load_si128(vP + i));
                    case1 = _mm_cmpeq_epi16(vH, vHp);
                    case2 = _mm_cmpeq_epi16(vH, vF);
                    cond = _mm_andnot_si128(case1,case2);
                    vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                    vT = _mm_load_si128(pvHT + i);
                    vT = _mm_blendv_epi8_rpl(vT, vTDel, cond);
                    _mm_store_si128(pvHT + i, vT);
                    vTAll = _mm_and_si128(vTAll, vTMask);
                    vTAll = _mm_or_si128(vTAll, vT);
                    arr_store(result->trace->trace_table, vTAll, i, segLen, j);
                }
                /* Update vF value. */
                {
                    __m128i vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                    __m128i cond = _mm_cmpgt_epi16(vEF_opn, vFa_ext);
                    __m128i vT = _mm_blendv_epi8_rpl(vTDelF, vTDiagF, cond);
                    vTAll = _mm_and_si128(vTAll, vFTMask);
                    vTAll = _mm_or_si128(vTAll, vT);
                    arr_store(result->trace->trace_table, vTAll, i, segLen, j);
                }
                vEF_opn = _mm_subs_epi16(vH, vGapO);
                vF_ext = _mm_subs_epi16(vF, vGapE);
                {
                    __m128i vEa = _mm_load_si128(pvEaLoad + i);
                    __m128i vEa_ext = _mm_subs_epi16(vEa, vGapE);
                    vEa = _mm_max_epi16(vEF_opn, vEa_ext);
                    _mm_store_si128(pvEaStore + i, vEa);
                    if (j+1<s2Len) {
                        __m128i cond = _mm_cmpgt_epi16(vEF_opn, vEa_ext);
                        __m128i vT = _mm_blendv_epi8_rpl(vTInsE, vTDiagE, cond);
                        arr_store(result->trace->trace_table, vT, i, segLen, j+1);
                    }
                }
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi16(vF_ext, vEF_opn),
                                _mm_cmpeq_epi16(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm_max_epi16(vEF_opn, vF_ext);*/
                vF = vF_ext;
                vFa_ext = _mm_subs_epi16(vFa, vGapE);
                vFa = _mm_max_epi16(vEF_opn, vFa_ext);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }
    }

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 2);
        }
        score = (int16_t) _mm_extract_epi16 (vH, 7);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvHT);
    parasail_free(pvEaLoad);
    parasail_free(pvEaStore);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}